

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

size_t stumpless_get_element_index(stumpless_entry *entry,char *name)

{
  stumpless_element *element_00;
  _Bool _Var1;
  int iVar2;
  wchar_t cmp_result;
  stumpless_element *element;
  size_t i;
  size_t name_len;
  char *name_local;
  stumpless_entry *entry_local;
  
  name_len = (size_t)name;
  name_local = (char *)entry;
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
    entry_local = (stumpless_entry *)0x0;
  }
  else if (name == (char *)0x0) {
    raise_argument_empty("name was NULL");
    entry_local = (stumpless_entry *)0x0;
  }
  else {
    _Var1 = validate_element_name(name,&i);
    if (_Var1) {
      lock_entry((stumpless_entry *)name_local);
      for (element = (stumpless_element *)0x0; element < *(stumpless_element **)(name_local + 0x228)
          ; element = (stumpless_element *)(element->name + 1)) {
        element_00 = *(stumpless_element **)(*(long *)(name_local + 0x220) + (long)element * 8);
        lock_element(element_00);
        iVar2 = memcmp(element_00,(void *)name_len,i);
        unlock_element(element_00);
        if (iVar2 == 0) {
          clear_error();
          goto LAB_0010c8d7;
        }
      }
      element = (stumpless_element *)0x0;
      raise_element_not_found();
LAB_0010c8d7:
      unlock_entry((stumpless_entry *)name_local);
      entry_local = (stumpless_entry *)element;
    }
    else {
      entry_local = (stumpless_entry *)0x0;
    }
  }
  return (size_t)entry_local;
}

Assistant:

size_t
stumpless_get_element_index( const struct stumpless_entry *entry,
                             const char *name ) {
  size_t name_len;
  size_t i;
  const struct stumpless_element *element;
  int cmp_result;

  VALIDATE_ARG_NOT_NULL_UNSIGNED_RETURN( entry );
  VALIDATE_ARG_NOT_NULL_UNSIGNED_RETURN( name );

  if ( unlikely( !validate_element_name( name, &name_len ) ) ) {
    return 0;
  }

  lock_entry( entry );
  for( i = 0; i < entry->element_count; i++ ) {
    element = entry->elements[i];

    lock_element( element );
    cmp_result = memcmp( element->name, name, name_len );
    unlock_element( element );

    if( cmp_result == 0 ) {
      clear_error(  );
      goto cleanup_and_return;
    }
  }

  i = 0;
  raise_element_not_found(  );

cleanup_and_return:
  unlock_entry( entry );
  return i;
}